

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

QSqlRecord __thiscall QSQLiteDriver::record(QSQLiteDriver *this,QString *tablename)

{
  long lVar1;
  QSqlQuery *query;
  undefined8 uVar2;
  char cVar3;
  QSqlResult *pQVar4;
  bool in_DL;
  long in_FS_OFFSET;
  undefined1 local_88 [80];
  QSqlQuery q;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  query = (QSqlQuery *)(tablename->d).ptr;
  cVar3 = (**(code **)&(tablename->d).d[6].super_QArrayData)(tablename);
  if (cVar3 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QSqlRecord::QSqlRecord((QSqlRecord *)this);
      return (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)this;
    }
  }
  else {
    _q = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (QSqlResult *)(*(code *)(tablename->d).d[0xc].super_QArrayData.alloc)(tablename);
    QSqlQuery::QSqlQuery(&q,pQVar4);
    QSqlQuery::setForwardOnly(SUB81(&q,0));
    QSQLiteDriverPrivate::getTableInfo((QSQLiteDriverPrivate *)local_88,query,(QString *)&q,in_DL);
    uVar2 = local_88._0_8_;
    local_88._0_8_ = 0;
    *(undefined8 *)this = uVar2;
    QSqlIndex::~QSqlIndex((QSqlIndex *)local_88);
    QSqlQuery::~QSqlQuery(&q);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSqlRecord QSQLiteDriver::record(const QString &tablename) const
{
    Q_D(const QSQLiteDriver);
    if (!isOpen())
        return QSqlRecord();

    QSqlQuery q(createResult());
    q.setForwardOnly(true);
    return d->getTableInfo(q, tablename);
}